

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_pool_2d_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *af,ggml_op_pool op,int k0,int k1,
                 int s0,int s1,float p0,float p1)

{
  ggml_tensor *tensor;
  ggml_op_pool local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  undefined8 local_44;
  
  tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,4,af->ne);
  local_4c = s0;
  local_48 = s1;
  local_44 = CONCAT44((int)p1,(int)p0);
  local_58 = op;
  local_54 = k0;
  local_50 = k1;
  ggml_set_op_params(tensor,&local_58,0x1c);
  tensor->op = GGML_OP_POOL_2D_BACK;
  tensor->src[0] = a;
  tensor->src[1] = af;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_pool_2d_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * af,
        enum ggml_op_pool     op,
        int                   k0,
        int                   k1,
        int                   s0,
        int                   s1,
        float                 p0,
        float                 p1) {
    struct ggml_tensor * result;
    result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, af->ne);

    int32_t params[] = { op, k0, k1, s0, s1, p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_2D_BACK;
    result->src[0] = a;
    result->src[1] = af;

    return result;
}